

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

char * openjtalk_getHTSVoicePath(OpenJTalk *oj,HtsVoiceFilelist *list,uint i,char *path)

{
  char *pcVar1;
  int iVar2;
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else if (list != (HtsVoiceFilelist *)0x0) {
    iVar2 = i + 1;
    do {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) {
        memset(path,0,0x104);
        pcVar1 = strcpy(path,(list->field_1).pathSjis);
        return pcVar1;
      }
      list = list->succ;
    } while (list != (HtsVoiceFilelist_tag *)0x0);
  }
  return (char *)0x0;
}

Assistant:

OPENJTALK_DLL_API char *OPENJTALK_CONVENTION openjtalk_getHTSVoicePath(OpenJTalk *oj, HtsVoiceFilelist *list, unsigned int i, char *path)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return NULL;
	}

	if (list == NULL)
	{
		return NULL;
	}

	//HtsVoiceFilelist* temp = list;
	unsigned int counter = 0;
	for (HtsVoiceFilelist *temp = list; temp != NULL; temp = temp->succ)
	{
		if (counter++ == i)
		{
			if (temp)
			{
				clear_path_string(path, MAX_PATH);
				strcpy(path, temp->path);
				return path;
			}
			else
			{
				return NULL;
			}
		}
	}
	return NULL;
}